

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

void __thiscall ProcessThread::run(ProcessThread *this)

{
  Process *this_00;
  int iVar1;
  element_type *this_01;
  ssize_t sVar2;
  iterator __position;
  Event *event;
  int *piVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  char ch;
  pid_t p;
  int ret;
  SharedPtr loop;
  char local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  unique_lock<std::mutex> lock;
  Log local_50;
  Log local_40;
  
  do {
    do {
      sVar2 = read(sProcessPipe[0],&ch,1);
    } while (sVar2 != 1);
    if (ch == 's') {
      return;
    }
    std::unique_lock<std::mutex>::unique_lock(&lock,&sProcessMutex);
    do {
      while( true ) {
        p = waitpid(0,&ret,1);
        if (p == -1) break;
        if (p == 0) goto LAB_0018ec83;
        ret = -(uint)((ret & 0x7fU) != 0) | (uint)ret >> 8 & 0xff;
        __position = std::
                     _Rb_tree<int,_std::pair<const_int,_ProcessThread::ProcessData>,_std::_Select1st<std::pair<const_int,_ProcessThread::ProcessData>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ProcessThread::ProcessData>_>_>
                     ::find(&sProcesses._M_t,&p);
        if ((_Rb_tree_header *)__position._M_node == &sProcesses._M_t._M_impl.super__Rb_tree_header)
        {
          if (sPending == 0) {
            error();
            Log::operator<<((Log *)&loop,local_70);
            Log::addStringStream<int>(&local_50,(int)(Log *)&loop);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
          }
          else {
            iVar4 = std::
                    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&sPendingPids._M_h,&p);
            iVar1 = ret;
            if (iVar4.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur !=
                (__node_type *)0x0) {
              __assert_fail("sPendingPids.find(p) == sPendingPids.end()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                            ,0xcc,"virtual void ProcessThread::run()");
            }
            pmVar5 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&sPendingPids,&p);
            *pmVar5 = iVar1;
          }
        }
        else {
          this_00 = (Process *)__position._M_node[1]._M_parent;
          if (this_00 != (Process *)0x0) {
            std::__shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>,
                       &__position._M_node[1]._M_left);
            std::
            _Rb_tree<int,std::pair<int_const,ProcessThread::ProcessData>,std::_Select1st<std::pair<int_const,ProcessThread::ProcessData>>,std::less<int>,std::allocator<std::pair<int_const,ProcessThread::ProcessData>>>
            ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,ProcessThread::ProcessData>,std::_Select1st<std::pair<int_const,ProcessThread::ProcessData>>,std::less<int>,std::allocator<std::pair<int_const,ProcessThread::ProcessData>>>
                                *)&sProcesses,__position);
            std::unique_lock<std::mutex>::unlock(&lock);
            this_01 = loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar1 = ret;
            if (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              Process::finish(this_00,ret);
            }
            else {
              event = (Event *)operator_new(0x20);
              event->_vptr_Event = (_func_int **)&PTR__Event_001b57d8;
              event[1]._vptr_Event = (_func_int **)this_00;
              *(int *)&event[2]._vptr_Event = iVar1;
              EventLoop::post(this_01,event);
            }
            std::unique_lock<std::mutex>::lock(&lock);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          }
        }
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    if (*piVar3 != 10) {
      error();
      Log::operator<<((Log *)&loop,local_70);
      Log::addStringStream<int>(&local_40,(int)(Log *)&loop);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
    }
LAB_0018ec83:
    std::unique_lock<std::mutex>::~unique_lock(&lock);
  } while( true );
}

Assistant:

void ProcessThread::run()
{
    ssize_t r;
    for (;;) {
        char ch;
        r = ::read(sProcessPipe[0], &ch, sizeof(char));
        if (r == 1) {
            if (ch == 's') {
                break;
            } else {
                int ret;
                pid_t p;
                std::unique_lock<std::mutex> lock(sProcessMutex);
                bool done = false;
                do {
                    // find out which process we're waking up on
                    eintrwrap(p, ::waitpid(0, &ret, WNOHANG));
                    switch (p) {
                    case 0:
                        // we're done
                        done = true;
                        break;
                    case -1:
                        done = true;
                        if (errno == ECHILD)
                            break;
                        // this is bad
                        error() << "waitpid error" << errno;
                        break;
                    default:
                        // printf("successfully waited for pid (got %d)\n", p);
                        // child process with pid=p just exited.
                        if (WIFEXITED(ret)) {
                            ret = WEXITSTATUS(ret);
                        } else {
                            ret = Process::ReturnCrashed;
                        }
                        // find the process object to this child process
                        auto proc = sProcesses.find(p);
                        if (proc != sProcesses.end()) {
                            Process *process = proc->second.proc;
                            if (process != nullptr) {
                                EventLoop::SharedPtr loop = proc->second.loop.lock();
                                sProcesses.erase(proc++);
                                lock.unlock();
                                if (loop) {
                                    loop->callLater([process, ret]() { process->finish(ret); });
                                } else {
                                    process->finish(ret);
                                }
                                lock.lock();
                            }
                        } else {
                            if (sPending) {
                                assert(sPendingPids.find(p) == sPendingPids.end());
                                sPendingPids[p] = ret;
                            } else {
                                error() << "couldn't find process for pid" << p;
                            }
                        }
                    }
                } while (!done);
            }
        }
    }
    // printf("process thread died for some reason\n");
}